

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O3

void __thiscall
GraphTestDyndepLoadOutputWithMultipleRules2::Run(GraphTestDyndepLoadOutputWithMultipleRules2 *this)

{
  VirtualFileSystem *this_00;
  DependencyScan *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Test *pTVar3;
  bool bVar4;
  int iVar5;
  Node *pNVar6;
  string err;
  string local_70;
  string local_50;
  
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "rule r\n  command = unused\nbuild out1: r in1 || dd1\n  dyndep = dd1\nbuild out2: r in2 || dd2\n  dyndep = dd2\n"
              ,(ManifestParserOptions)0x0);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"dd1","");
  paVar2 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"ninja_dyndep_version = 1\nbuild out1 | out-twice.imp: dyndep\n",""
            );
  this_00 = &(this->super_GraphTest).fs_;
  VirtualFileSystem::Create(this_00,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"dd2","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"ninja_dyndep_version = 1\nbuild out2 | out-twice.imp: dyndep\n",""
            );
  VirtualFileSystem::Create(this_00,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  pTVar3 = g_current_test;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"dd1","");
  pNVar6 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_70);
  bVar4 = testing::Test::Check
                    (pTVar3,pNVar6->dyndep_pending_,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                     ,0x25c,"GetNode(\"dd1\")->dyndep_pending()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pTVar3 = g_current_test;
  if (bVar4) {
    local_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"dd1","");
    pNVar6 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_70);
    this_01 = &(this->super_GraphTest).scan_;
    bVar4 = DependencyScan::LoadDyndeps(this_01,pNVar6,&local_50);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x25d,"scan_.LoadDyndeps(GetNode(\"dd1\"), &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pTVar3 = g_current_test;
    iVar5 = std::__cxx11::string::compare((char *)&local_50);
    testing::Test::Check
              (pTVar3,iVar5 == 0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x25e,"\"\" == err");
    pTVar3 = g_current_test;
    local_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"dd2","");
    pNVar6 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_70);
    bVar4 = testing::Test::Check
                      (pTVar3,pNVar6->dyndep_pending_,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                       ,0x25f,"GetNode(\"dd2\")->dyndep_pending()");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pTVar3 = g_current_test;
    if (bVar4) {
      local_70._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"dd2","");
      pNVar6 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_70);
      bVar4 = DependencyScan::LoadDyndeps(this_01,pNVar6,&local_50);
      testing::Test::Check
                (pTVar3,!bVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                 ,0x260,"scan_.LoadDyndeps(GetNode(\"dd2\"), &err)");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pTVar3 = g_current_test;
      iVar5 = std::__cxx11::string::compare((char *)&local_50);
      testing::Test::Check
                (pTVar3,iVar5 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                 ,0x261,"\"multiple rules generate out-twice.imp\" == err");
      goto LAB_001643c7;
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_001643c7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(GraphTest, DyndepLoadOutputWithMultipleRules2) {
  AssertParse(&state_,
"rule r\n"
"  command = unused\n"
"build out1: r in1 || dd1\n"
"  dyndep = dd1\n"
"build out2: r in2 || dd2\n"
"  dyndep = dd2\n"
  );
  fs_.Create("dd1",
"ninja_dyndep_version = 1\n"
"build out1 | out-twice.imp: dyndep\n"
  );
  fs_.Create("dd2",
"ninja_dyndep_version = 1\n"
"build out2 | out-twice.imp: dyndep\n"
  );

  string err;
  ASSERT_TRUE(GetNode("dd1")->dyndep_pending());
  EXPECT_TRUE(scan_.LoadDyndeps(GetNode("dd1"), &err));
  EXPECT_EQ("", err);
  ASSERT_TRUE(GetNode("dd2")->dyndep_pending());
  EXPECT_FALSE(scan_.LoadDyndeps(GetNode("dd2"), &err));
  EXPECT_EQ("multiple rules generate out-twice.imp", err);
}